

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O1

int DIR_mkdir(void *opaque,char *name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 *puVar5;
  undefined1 *ptr;
  ulong len;
  undefined1 auStack_38 [8];
  
  puVar5 = auStack_38;
  if (opaque == (void *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen((char *)opaque);
  }
  sVar3 = strlen(name);
  len = sVar3 + sVar2 + 1;
  iVar1 = 0;
  if (len < 0x100) {
    puVar5 = auStack_38 + -(sVar3 + sVar2 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar5;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar5 + -8) = 0x10cc62;
  pcVar4 = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)(puVar5 + -8) = 0x10cc73;
  pcVar4 = cvtToDependent((char *)opaque,name,pcVar4,len);
  if (pcVar4 != (char *)0x0) {
    *(undefined8 *)(puVar5 + -8) = 0x10cc83;
    iVar1 = __PHYSFS_platformMkDir(pcVar4);
    *(undefined8 *)(puVar5 + -8) = 0x10cc8e;
    __PHYSFS_smallFree(pcVar4);
  }
  return iVar1;
}

Assistant:

static int DIR_mkdir(void *opaque, const char *name)
{
    int retval;
    char *f;

    CVT_TO_DEPENDENT(f, opaque, name);
    BAIL_IF_ERRPASS(!f, 0);
    retval = __PHYSFS_platformMkDir(f);
    __PHYSFS_smallFree(f);
    return retval;
}